

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.h
# Opt level: O2

void __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::SetInitialDualValue
          (BasicProblem<mp::BasicProblemParams<int>_> *this,int con_index,double value)

{
  pointer pdVar1;
  
  pdVar1 = (this->initial_dual_values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->initial_dual_values_).super__Vector_base<double,_std::allocator<double>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pdVar1 >> 3) <=
      (ulong)(uint)con_index) {
    std::vector<double,_std::allocator<double>_>::reserve
              (&this->initial_dual_values_,
               ((long)(this->algebraic_cons_).
                      super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
               (long)(this->algebraic_cons_).
                     super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x88);
    std::vector<double,_std::allocator<double>_>::resize
              (&this->initial_dual_values_,
               (long)(int)(((long)(this->algebraic_cons_).
                                  super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->algebraic_cons_).
                                 super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0x88));
    std::vector<int,_std::allocator<int>_>::reserve
              (&this->idv_set_,
               ((long)(this->algebraic_cons_).
                      super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
               (long)(this->algebraic_cons_).
                     super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x88);
    std::vector<int,_std::allocator<int>_>::resize
              (&this->idv_set_,
               (long)(int)(((long)(this->algebraic_cons_).
                                  super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->algebraic_cons_).
                                 super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0x88));
    pdVar1 = (this->initial_dual_values_).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
  }
  pdVar1[con_index] = value;
  (this->idv_set_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[con_index] = 1;
  return;
}

Assistant:

void SetInitialDualValue(int con_index, double value) {
    MP_ASSERT(0 <= con_index && con_index < num_algebraic_cons(),
              "invalid index");
    if (initial_dual_values_.size() <= static_cast<unsigned>(con_index)) {
      initial_dual_values_.reserve(algebraic_cons_.capacity());
      initial_dual_values_.resize(num_algebraic_cons());
      idv_set_.reserve(algebraic_cons_.capacity());
      idv_set_.resize(num_algebraic_cons());
    }
    initial_dual_values_[con_index] = value;
    idv_set_[con_index] = 1;
  }